

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_11.cpp
# Opt level: O2

Link * __thiscall Link::find(Link *this,string *s)

{
  __type _Var1;
  
  while( true ) {
    if (this == (Link *)0x0) {
      return (Link *)0x0;
    }
    _Var1 = std::operator==(&this->value,s);
    if (_Var1) break;
    this = this->succ;
  }
  return this;
}

Assistant:

Link* Link::find(const std::string& s)
{
	Link* p = this;
	while (p)
	{
		if (p->value == s)
			return p;
		p = p->succ;
	}
	return nullptr;
}